

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::DecrementUnderflowHelper(ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  
  uVar3 = NumberUtilities::ToSpecial(-2147483649.0);
  bVar2 = NumberUtilities::IsNan(-2147483649.0);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(-2147483649.0);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(-2147483649.0);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  return (Var)(uVar3 ^ 0xfffc000000000000);
}

Assistant:

_NOINLINE Var __stdcall TaggedInt::DecrementUnderflowHelper(ScriptContext* scriptContext)
    {
        return JavascriptNumber::New( k_nMinValue - 1.0, scriptContext );
    }